

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c.cc
# Opt level: O3

uint32_t leveldb::crc32c::Extend(uint32_t crc,char *data,size_t n)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  long lVar9;
  uint *puVar10;
  uint *puVar11;
  uint uVar12;
  
  if (Extend(unsigned_int,char_const*,unsigned_long)::accelerate == '\0') {
    Extend();
  }
  puVar10 = (uint *)(data + n);
  uVar12 = ~crc;
  puVar4 = (uint *)((ulong)(data + 3) & 0xfffffffffffffffc);
  puVar11 = (uint *)data;
  if ((long)puVar4 - (long)data != 0 && puVar4 <= puVar10) {
    do {
      puVar8 = (uint *)((long)puVar11 + 1);
      uVar12 = uVar12 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable +
                        (ulong)((uint)(byte)*puVar11 ^ uVar12 & 0xff) * 4);
      puVar11 = puVar8;
    } while (puVar8 != puVar4);
    puVar11 = (uint *)(data + ((long)puVar4 - (long)data));
    data = (char *)puVar4;
  }
  if (0xf < (long)puVar10 - (long)data) {
    uVar12 = uVar12 ^ *puVar11;
    uVar3 = puVar11[1];
    uVar5 = puVar11[2];
    uVar6 = puVar11[3];
    puVar11 = puVar11 + 4;
    for (lVar9 = (long)puVar10 - (long)puVar11; 0xf < lVar9; lVar9 = lVar9 + -0x10) {
      uVar12 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar12 & 0xff) * 4)
               ^ *puVar11 ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                        (ulong)(uVar12 >> 8 & 0xff) * 4) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar12 >> 0xe & 0x3fc)) ^
               *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar12 >> 0x18) * 4
                        );
      uVar3 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar3 & 0xff) * 4) ^
              puVar11[1] ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar3 >> 8 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar3 >> 0xe & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar3 >> 0x18) * 4);
      uVar5 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar5 & 0xff) * 4) ^
              puVar11[2] ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar5 >> 8 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar5 >> 0xe & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar5 >> 0x18) * 4);
      uVar6 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar6 & 0xff) * 4) ^
              puVar11[3] ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                       (ulong)(uVar6 >> 8 & 0xff) * 4) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar6 >> 0xe & 0x3fc)) ^
              *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar6 >> 0x18) * 4);
      puVar11 = puVar11 + 4;
    }
    if (3 < lVar9) {
      lVar9 = (long)puVar10 - (long)puVar11;
      uVar7 = uVar12;
      uVar1 = uVar3;
      uVar2 = uVar5;
      do {
        uVar5 = uVar6;
        uVar3 = uVar2;
        uVar12 = uVar1;
        uVar6 = *(uint *)((anonymous_namespace)::kStrideExtensionTable3 + (ulong)(uVar7 & 0xff) * 4)
                ^ *puVar11 ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable2 +
                         (ulong)(uVar7 >> 8 & 0xff) * 4) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable1 + (uVar7 >> 0xe & 0x3fc)) ^
                *(uint *)((anonymous_namespace)::kStrideExtensionTable0 + (ulong)(uVar7 >> 0x18) * 4
                         );
        puVar11 = puVar11 + 1;
        lVar9 = lVar9 + -4;
        uVar7 = uVar12;
        uVar1 = uVar3;
        uVar2 = uVar5;
      } while (3 < lVar9);
    }
    lVar9 = 4;
    do {
      uVar12 = uVar12 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + ((ulong)uVar12 & 0xff) * 4);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    uVar12 = uVar12 ^ uVar3;
    lVar9 = 4;
    do {
      uVar12 = uVar12 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar12 & 0xff) * 4);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    uVar12 = uVar12 ^ uVar5;
    lVar9 = 4;
    do {
      uVar12 = uVar12 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar12 & 0xff) * 4);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    uVar12 = uVar12 ^ uVar6;
    lVar9 = 4;
    do {
      uVar12 = uVar12 >> 8 ^
               *(uint *)((anonymous_namespace)::kByteExtensionTable + (ulong)(uVar12 & 0xff) * 4);
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  for (; puVar11 != puVar10; puVar11 = (uint *)((long)puVar11 + 1)) {
    uVar12 = uVar12 >> 8 ^
             *(uint *)((anonymous_namespace)::kByteExtensionTable +
                      (ulong)((uint)(byte)*puVar11 ^ uVar12 & 0xff) * 4);
  }
  return ~uVar12;
}

Assistant:

uint32_t Extend(uint32_t crc, const char* data, size_t n) {
  static bool accelerate = CanAccelerateCRC32C();
  if (accelerate) {
    return port::AcceleratedCRC32C(crc, data, n);
  }

  const uint8_t* p = reinterpret_cast<const uint8_t*>(data);
  const uint8_t* e = p + n;
  uint32_t l = crc ^ kCRC32Xor;

// Process one byte at a time.
#define STEP1                              \
  do {                                     \
    int c = (l & 0xff) ^ *p++;             \
    l = kByteExtensionTable[c] ^ (l >> 8); \
  } while (0)

// Process one of the 4 strides of 4-byte data.
#define STEP4(s)                                                               \
  do {                                                                         \
    crc##s = ReadUint32LE(p + s * 4) ^ kStrideExtensionTable3[crc##s & 0xff] ^ \
             kStrideExtensionTable2[(crc##s >> 8) & 0xff] ^                    \
             kStrideExtensionTable1[(crc##s >> 16) & 0xff] ^                   \
             kStrideExtensionTable0[crc##s >> 24];                             \
  } while (0)

// Process a 16-byte swath of 4 strides, each of which has 4 bytes of data.
#define STEP16 \
  do {         \
    STEP4(0);  \
    STEP4(1);  \
    STEP4(2);  \
    STEP4(3);  \
    p += 16;   \
  } while (0)

// Process 4 bytes that were already loaded into a word.
#define STEP4W(w)                                   \
  do {                                              \
    w ^= l;                                         \
    for (size_t i = 0; i < 4; ++i) {                \
      w = (w >> 8) ^ kByteExtensionTable[w & 0xff]; \
    }                                               \
    l = w;                                          \
  } while (0)

  // Point x at first 4-byte aligned byte in the buffer. This might be past the
  // end of the buffer.
  const uint8_t* x = RoundUp<4>(p);
  if (x <= e) {
    // Process bytes p is 4-byte aligned.
    while (p != x) {
      STEP1;
    }
  }

  if ((e - p) >= 16) {
    // Load a 16-byte swath into the stride partial results.
    uint32_t crc0 = ReadUint32LE(p + 0 * 4) ^ l;
    uint32_t crc1 = ReadUint32LE(p + 1 * 4);
    uint32_t crc2 = ReadUint32LE(p + 2 * 4);
    uint32_t crc3 = ReadUint32LE(p + 3 * 4);
    p += 16;

    // It is possible to get better speeds (at least on x86) by interleaving
    // prefetching 256 bytes ahead with processing 64 bytes at a time. See the
    // portable implementation in https://github.com/google/crc32c/.

    // Process one 16-byte swath at a time.
    while ((e - p) >= 16) {
      STEP16;
    }

    // Advance one word at a time as far as possible.
    while ((e - p) >= 4) {
      STEP4(0);
      uint32_t tmp = crc0;
      crc0 = crc1;
      crc1 = crc2;
      crc2 = crc3;
      crc3 = tmp;
      p += 4;
    }

    // Combine the 4 partial stride results.
    l = 0;
    STEP4W(crc0);
    STEP4W(crc1);
    STEP4W(crc2);
    STEP4W(crc3);
  }

  // Process the last few bytes.
  while (p != e) {
    STEP1;
  }
#undef STEP4W
#undef STEP16
#undef STEP4
#undef STEP1
  return l ^ kCRC32Xor;
}